

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_interpdump(CHAR_DATA *ch,char *argument)

{
  FILE *pFVar1;
  int bit;
  int k;
  int j;
  int i;
  FILE *fp;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  pFVar1 = fopen("../logs/interpdump.txt","w");
  local_1c = 0;
  while (cmd_table[local_1c].do_fun != (DO_FUN *)0x0) {
    local_28 = 0;
    if (cmd_table[local_1c].show == 0) {
      local_28 = 2;
    }
    if (cmd_table[local_1c].hide == 1) {
      local_28 = local_28 + 1;
    }
    fprintf(pFVar1,";%s;0;do_%s;%d;%d;%d;\n",cmd_table[local_1c].name,cmd_table[local_1c].name,
            (ulong)(uint)(int)cmd_table[local_1c].level,(ulong)(uint)(int)cmd_table[local_1c].log,
            local_28);
    local_1c = local_1c + 1;
  }
  fclose(pFVar1);
  pFVar1 = fopen("../logs/climate-dump.txt","w");
  local_1c = 0;
  while (climate_table[local_1c].number != 8) {
    fprintf(pFVar1,"%s;%d;",climate_table[local_1c].name,
            (ulong)(uint)(int)climate_table[local_1c].number);
    for (local_20 = 0; local_20 < 9; local_20 = local_20 + 1) {
      if (local_20 != 0) {
        fprintf(pFVar1,",");
      }
      for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
        if (local_24 != 0) {
          fprintf(pFVar1,"|");
        }
        fprintf(pFVar1,"%d",
                (ulong)(uint)(int)*(short *)((long)local_1c * 0x78 + 0x91a5fa +
                                             (long)local_24 * 0x12 + (long)local_20 * 2));
      }
    }
    fprintf(pFVar1,";");
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      if (local_20 != 0) {
        fprintf(pFVar1,",");
      }
      for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
        if (local_24 != 0) {
          fprintf(pFVar1,"|");
        }
        fprintf(pFVar1,"%d",
                (ulong)(uint)(int)*(short *)((long)local_1c * 0x78 + 0x91a642 + (long)local_24 * 8 +
                                            (long)local_20 * 2));
      }
    }
    fprintf(pFVar1,";\n");
    local_1c = local_1c + 1;
  }
  fclose(pFVar1);
  return;
}

Assistant:

void do_interpdump(CHAR_DATA *ch, char *argument)
{
	FILE *fp = fopen(INTERP_DUMP_FILE, "w");
	int i = 0, j = 0, k = 0;
	int bit = 0;

	for (i = 0; cmd_table[i].do_fun != nullptr; i++)
	{
		bit = 0;

		if (cmd_table[i].show == 0)
			bit += 2;

		if (cmd_table[i].hide == 1)
			bit += 1;

		fprintf(fp, ";%s;0;do_%s;%d;%d;%d;\n", cmd_table[i].name, cmd_table[i].name, cmd_table[i].level, cmd_table[i].log, bit);
	}
	fclose(fp);

	fp = fopen(CLIMATE_DUMP_FILE, "w");

	for (i = 0; climate_table[i].number != Climate::English; i++)
	{
		fprintf(fp, "%s;%d;", climate_table[i].name, climate_table[i].number);

		for (j = 0; j < WeatherCondition::MaxWeatherCondition; j++)
		{
			if (j != 0)
				fprintf(fp, ",");

			for (k = 0; k < Seasons::SeasonsCount; k++)
			{
				if (k != 0)
					fprintf(fp, "|");

				fprintf(fp, "%d", climate_table[i].skyfreqs[k][j]);
			}
		}

		fprintf(fp, ";");

		for (j = 0; j < Temperature::MaxTemperature; j++)
		{
			if (j != 0)
				fprintf(fp, ",");

			for (k = 0; k < Seasons::SeasonsCount; k++)
			{
				if (k != 0)
					fprintf(fp, "|");

				fprintf(fp, "%d", climate_table[i].tempfreqs[k][j]);
			}
		}

		fprintf(fp, ";\n");
	}

	fclose(fp);
}